

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::EncodeMaterialFileName(ObjEncoder *this)

{
  GeometryMetadata *this_00;
  bool bVar1;
  AttributeMetadata *this_01;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  PointAttribute *pPVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *__range1;
  allocator<char> local_91;
  string material_file_name;
  int value;
  string material_full_path;
  
  this_00 = (this->in_point_cloud_->metadata_)._M_t.
            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if (this_00 == (GeometryMetadata *)0x0) {
    this_01 = (AttributeMetadata *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&material_file_name,"name",(allocator<char> *)&value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&material_full_path,"material",&local_91);
    this_01 = GeometryMetadata::GetAttributeMetadataByStringEntry
                        (this_00,&material_file_name,&material_full_path);
    std::__cxx11::string::~string((string *)&material_full_path);
    std::__cxx11::string::~string((string *)&material_file_name);
  }
  material_file_name._M_dataplus._M_p = (pointer)&material_file_name.field_2;
  material_file_name._M_string_length = 0;
  material_full_path._M_dataplus._M_p = (pointer)&material_full_path.field_2;
  material_full_path._M_string_length = 0;
  material_file_name.field_2._M_local_buf[0] = '\0';
  material_full_path.field_2._M_local_buf[0] = '\0';
  if (this_01 == (AttributeMetadata *)0x0) {
    bVar1 = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&value,"file_name",&local_91);
    bVar1 = Metadata::GetEntryString(&this_01->super_Metadata,(string *)&value,&material_file_name);
    std::__cxx11::string::~string((string *)&value);
    if (bVar1) {
      EncoderBuffer::Encode(this->out_buffer_,"mtllib ",7);
      EncoderBuffer::Encode
                (this->out_buffer_,material_file_name._M_dataplus._M_p,
                 material_file_name._M_string_length);
      EncoderBuffer::Encode(this->out_buffer_,"\n",1);
      std::
      _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->material_id_to_name_)._M_h);
      for (p_Var3 = (this_01->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var3 !=
          &(this_01->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        value = 0;
        if ((long)p_Var3[2]._M_parent - (long)*(int **)(p_Var3 + 2) == 4) {
          value = **(int **)(p_Var3 + 2);
          pmVar2 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->material_id_to_name_,&value);
          std::__cxx11::string::_M_assign((string *)pmVar2);
        }
      }
      pPVar4 = PointCloud::GetAttributeByUniqueId(this->in_point_cloud_,this_01->att_unique_id_);
      this->material_att_ = pPVar4;
      if (pPVar4 != (PointAttribute *)0x0) {
        bVar1 = pPVar4->num_unique_entries_ != 0;
        goto LAB_0010ed8b;
      }
    }
    bVar1 = false;
  }
LAB_0010ed8b:
  std::__cxx11::string::~string((string *)&material_full_path);
  std::__cxx11::string::~string((string *)&material_file_name);
  return bVar1;
}

Assistant:

bool ObjEncoder::EncodeMaterialFileName() {
  const GeometryMetadata *pc_metadata = in_point_cloud_->GetMetadata();
  const AttributeMetadata *material_metadata = nullptr;
  if (pc_metadata) {
    material_metadata =
        pc_metadata->GetAttributeMetadataByStringEntry("name", "material");
  }
  std::string material_file_name;
  std::string material_full_path;
  if (!material_metadata) {
    return true;
  }
  if (!material_metadata->GetEntryString("file_name", &material_file_name))
    return false;
  buffer()->Encode("mtllib ", 7);
  buffer()->Encode(material_file_name.c_str(), material_file_name.size());
  buffer()->Encode("\n", 1);
  material_id_to_name_.clear();
  for (const auto &entry : material_metadata->entries()) {
    // Material id must be int.
    int value = 0;
    // Found entry that are not material id, e.g. file name as a string.
    if (!entry.second.GetValue(&value)) {
      continue;
    }
    material_id_to_name_[value] = entry.first;
  }
  material_att_ = in_point_cloud_->GetAttributeByUniqueId(
      material_metadata->att_unique_id());
  if (material_att_ == nullptr || material_att_->size() == 0) {
    return false;
  }
  return true;
}